

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tap.c
# Opt level: O0

int tap_test_died(int status)

{
  int iVar1;
  int prev;
  int status_local;
  
  if (tap_test_died::test_died == (int *)0x0) {
    tap_test_died::test_died = (int *)mmap((void *)0x0,4,3,0x21,-1,0);
    *tap_test_died::test_died = 0;
  }
  iVar1 = *tap_test_died::test_died;
  *tap_test_died::test_died = status;
  return iVar1;
}

Assistant:

int
tap_test_died (int status) {
    static int *test_died = NULL;
    int prev;
    if (!test_died) {
        test_died = mmap(0, sizeof (int), PROT_READ | PROT_WRITE,
                         MAP_SHARED | MAP_ANONYMOUS, -1, 0);
        *test_died = 0;
    }
    prev = *test_died;
    *test_died = status;
    return prev;
}